

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  size_t __n_00;
  size_t in_RAX;
  int *piVar1;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((FILE *)this->fd_ != (FILE *)0x0) {
    __n_00 = *(size_t *)(CONCAT44(in_register_00000034,__fd) + 0x10);
    in_RAX = fwrite(*(void **)(CONCAT44(in_register_00000034,__fd) + 8),1,__n_00,(FILE *)this->fd_);
    if (in_RAX != __n_00) {
      std::__cxx11::string::string((string *)&local_30,(string *)&this->filename_);
      std::operator+(&local_50,"Failed writing to file ",&local_30);
      piVar1 = __errno_location();
      throw_spdlog_ex(&local_50,*piVar1);
    }
  }
  return in_RAX;
}

Assistant:

SPDLOG_INLINE void file_helper::write(const memory_buf_t &buf) {
    if (fd_ == nullptr) return;
    size_t msg_size = buf.size();
    auto data = buf.data();
    if (std::fwrite(data, 1, msg_size, fd_) != msg_size) {
        throw_spdlog_ex("Failed writing to file " + os::filename_to_str(filename_), errno);
    }
}